

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O0

int Mecab_analysis(Mecab *m,char *str)

{
  ushort uVar1;
  byte bVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RSI;
  long *in_RDI;
  string f;
  Node *node_1;
  int index;
  Node *node;
  Lattice *lattice;
  Tagger *tagger;
  Mecab *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [32];
  long local_40;
  int local_34;
  long local_30;
  long *local_28;
  undefined8 *local_20;
  long local_18;
  long *local_10;
  int local_4;
  
  if ((((in_RDI[2] == 0) || (in_RDI[3] == 0)) || (in_RDI[4] == 0)) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((0 < (int)in_RDI[1]) || (*in_RDI != 0)) {
      Mecab_refresh(in_stack_ffffffffffffff70);
    }
    local_20 = (undefined8 *)local_10[3];
    local_28 = (long *)local_10[4];
    (**(code **)(*local_28 + 0x48))(local_28,local_18);
    bVar2 = (**(code **)*local_20)(local_20,local_28);
    if ((bVar2 & 1) == 0) {
      (**(code **)*local_28)();
      local_4 = 0;
    }
    else {
      for (local_30 = (**(code **)(*local_28 + 0x10))(); local_30 != 0;
          local_30 = *(long *)(local_30 + 8)) {
        if ((*(char *)(local_30 + 0x4f) != '\x02') && (*(char *)(local_30 + 0x4f) != '\x03')) {
          *(int *)(local_10 + 1) = (int)local_10[1] + 1;
        }
      }
      if ((int)local_10[1] == 0) {
        local_4 = 1;
      }
      else {
        pvVar3 = calloc((long)(int)local_10[1],8);
        *local_10 = (long)pvVar3;
        local_34 = 0;
        for (local_40 = (**(code **)(*local_28 + 0x10))(); local_40 != 0;
            local_40 = *(long *)(local_40 + 8)) {
          if ((*(char *)(local_40 + 0x4f) != '\x02') && (*(char *)(local_40 + 0x4f) != '\x03')) {
            pcVar4 = *(char **)(local_40 + 0x30);
            uVar1 = *(ushort *)(local_40 + 0x44);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_60,pcVar4,(ulong)uVar1,&local_61);
            std::allocator<char>::~allocator((allocator<char> *)&local_61);
            std::__cxx11::string::operator+=(local_60,",");
            std::__cxx11::string::operator+=(local_60,*(char **)(local_40 + 0x38));
            pcVar4 = (char *)std::__cxx11::string::c_str();
            pcVar4 = strdup(pcVar4);
            *(char **)(*local_10 + (long)local_34 * 8) = pcVar4;
            local_34 = local_34 + 1;
            std::__cxx11::string::~string(local_60);
          }
        }
        (**(code **)*local_28)();
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

BOOL Mecab_analysis(Mecab *m, const char *str)
{
   if(m->model == NULL || m->tagger == NULL || m->lattice == NULL || str == NULL)
      return FALSE;

   if(m->size > 0 || m->feature != NULL)
      Mecab_refresh(m);

   MeCab::Tagger *tagger = (MeCab::Tagger *) m->tagger;
   MeCab::Lattice *lattice = (MeCab::Lattice *) m->lattice;

   lattice->set_sentence(str);

   if(tagger->parse(lattice) == false) {
      lattice->clear();
      return FALSE;
   }

   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE)
         m->size++;
   }

   if(m->size == 0)
      return TRUE;

   m->feature = (char **) calloc(m->size, sizeof(char *));
   int index = 0;
   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE) {
         std::string f(node->surface, node->length);
         f += ",";
         f += node->feature;
         m->feature[index] = strdup(f.c_str());
         index++;
      }
   }

   lattice->clear();

   return TRUE;
}